

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

MaybeTextureSwizzle * vkt::sr::anon_unknown_0::MaybeTextureSwizzle::createSomeTextureSwizzle(void)

{
  TextureSwizzleComponent *pTVar1;
  MaybeTextureSwizzle *in_RDI;
  MaybeTextureSwizzle *swizzle;
  
  MaybeTextureSwizzle(in_RDI);
  pTVar1 = tcu::Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::operator[]
                     (&in_RDI->m_swizzle,0);
  *pTVar1 = TEXTURESWIZZLECOMPONENT_R;
  pTVar1 = tcu::Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::operator[]
                     (&in_RDI->m_swizzle,1);
  *pTVar1 = TEXTURESWIZZLECOMPONENT_G;
  pTVar1 = tcu::Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::operator[]
                     (&in_RDI->m_swizzle,2);
  *pTVar1 = TEXTURESWIZZLECOMPONENT_B;
  pTVar1 = tcu::Vector<vkt::sr::(anonymous_namespace)::TextureSwizzleComponent,_4>::operator[]
                     (&in_RDI->m_swizzle,3);
  *pTVar1 = TEXTURESWIZZLECOMPONENT_A;
  in_RDI->m_isSome = true;
  return in_RDI;
}

Assistant:

MaybeTextureSwizzle MaybeTextureSwizzle::createSomeTextureSwizzle (void)
{
	MaybeTextureSwizzle swizzle;

	swizzle.m_swizzle[0] = TEXTURESWIZZLECOMPONENT_R;
	swizzle.m_swizzle[1] = TEXTURESWIZZLECOMPONENT_G;
	swizzle.m_swizzle[2] = TEXTURESWIZZLECOMPONENT_B;
	swizzle.m_swizzle[3] = TEXTURESWIZZLECOMPONENT_A;
	swizzle.m_isSome = true;

	return swizzle;
}